

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O0

int __thiscall
klogic::learning::
teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
::hits<klogic::learning::single_discrete_match<3>>
          (teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
           *this,single_discrete_match<3> *match)

{
  mvn *this_00;
  bool bVar1;
  pointer psVar2;
  cmplx local_40;
  __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
  local_30;
  __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
  local_28;
  const_iterator i;
  int count;
  single_discrete_match<3> *match_local;
  teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
  *this_local;
  
  i._M_current._4_4_ = 0;
  local_28._M_current =
       (sample<std::complex<double>_> *)
       std::
       vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
       ::begin((vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
                *)this);
  while( true ) {
    local_30._M_current =
         (sample<std::complex<double>_> *)
         std::
         vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
         ::end((vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
                *)this);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this_00 = *(mvn **)(this + 0x18);
    psVar2 = __gnu_cxx::
             __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
             ::operator->(&local_28);
    mvn::output(this_00,&psVar2->input);
    psVar2 = __gnu_cxx::
             __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
             ::operator->(&local_28);
    bVar1 = single_discrete_match<3>::operator()(match,&local_40,&psVar2->desired);
    if (bVar1) {
      i._M_current._4_4_ = i._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
    ::operator++(&local_28);
  }
  return i._M_current._4_4_;
}

Assistant:

int hits(Match const &match = Match()) const {
                int count = 0;

                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    if (match(learner.output(i->input), i->desired))
                        ++count;
                }

                return count;
            }